

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

int nh_http_parse_consume_header(http_context_t *ctx)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  char *pcVar5;
  nh_kv_anchor_t *pnVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  long lVar10;
  
  if ((ctx->header).items == (nh_kv_anchor_t *)0x0) {
    pnVar6 = (nh_kv_anchor_t *)malloc(0x80);
    (ctx->header).items = pnVar6;
    (ctx->header).capacity = 8;
    (ctx->header).length = 0;
  }
  uVar2 = (ctx->raw).index;
  pcVar5 = (ctx->raw).buf;
  lVar10 = 0;
  do {
    if ((pcVar5[uVar2 + (int)lVar10] == ':') && (pcVar5[uVar2 + 1 + (int)lVar10] == ' '))
    goto LAB_00105d34;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x80);
  lVar10 = 0xffffffff;
LAB_00105d34:
  uVar9 = (uint32_t)lVar10;
  if (-1 < (int)uVar9) {
    uVar7 = uVar2 + uVar9 + 2;
    (ctx->raw).index = uVar7;
    lVar10 = 0;
    do {
      if (pcVar5[uVar9 + uVar2 + 2 + (int)lVar10] == '\r') goto LAB_00105d6f;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x400);
    lVar10 = 0xffffffff;
LAB_00105d6f:
    uVar8 = (uint32_t)lVar10;
    if (0 < (int)uVar8) {
      (ctx->raw).index = uVar7 + uVar8;
      uVar3 = (ctx->header).capacity;
      if ((ctx->header).length == uVar3) {
        uVar4 = uVar3 * 2;
        (ctx->header).capacity = uVar4;
        pnVar6 = (nh_kv_anchor_t *)realloc((ctx->header).items,(ulong)uVar4 << 4);
        (ctx->header).items = pnVar6;
        if (pnVar6 == (nh_kv_anchor_t *)0x0) {
          __assert_fail("ctx->header.items != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/unbyte[P]naive-httpserver/lib/server.c"
                        ,0x21b,"int nh_http_parse_consume_header(http_context_t *)");
        }
      }
      pnVar6 = (ctx->header).items;
      uVar4 = (ctx->header).length;
      pnVar6[uVar4].key.index = uVar2;
      pnVar6[uVar4].key.len = uVar9;
      pnVar6[uVar4].value.index = uVar7;
      pnVar6[uVar4].value.len = uVar8;
      puVar1 = &(ctx->header).length;
      *puVar1 = *puVar1 + 1;
      return 1;
    }
  }
  return 0;
}

Assistant:

int nh_http_parse_consume_header(http_context_t *ctx) {
    if (ctx->header.items == NULL) {
        ctx->header.items = (nh_kv_anchor_t *) malloc(sizeof(nh_kv_anchor_t) * REQUEST_HEADER_INIT_SIZE);
        ctx->header.capacity = REQUEST_HEADER_INIT_SIZE;
        ctx->header.length = 0;
    }

    nh_stream_t *stream = &ctx->raw;
    uint32_t key_index = stream->index;
    int key_offset;
    if ((key_offset = nh_stream_find_next_char_tuple(stream, ": ", 128)) < 0) return 0;

    stream->index += key_offset + 2;
    uint32_t value_index = stream->index;

    int value_offset;
    if ((value_offset = nh_stream_find_next(stream, '\r', 1024)) <= 0) return 0;

    stream->index += value_offset;

    if (ctx->header.length == ctx->header.capacity) {
        ctx->header.capacity *= 2;
        ctx->header.items = (nh_kv_anchor_t *) realloc(ctx->header.items,
                                                       ctx->header.capacity * sizeof(nh_kv_anchor_t));
        assert(ctx->header.items != NULL);
    }

    ctx->header.items[ctx->header.length] = (nh_kv_anchor_t) {
        .key = {.index = key_index, .len = key_offset},
        .value = {.index = value_index, .len = value_offset}
    };
    ctx->header.length++;
    return 1;
}